

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.cpp
# Opt level: O1

void __thiscall QTextFormat::setObjectIndex(QTextFormat *this,int o)

{
  qsizetype *pqVar1;
  Property *pPVar2;
  Data *pDVar3;
  Property *pPVar4;
  Property *pPVar5;
  QTextFormatPrivate *pQVar6;
  long lVar7;
  long lVar8;
  Property *__dest;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (this->d).d.ptr;
  if (o == -1) {
    if (pQVar6 != (QTextFormatPrivate *)0x0) {
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextFormatPrivate>::detach_helper(&this->d);
      }
      pQVar6 = (this->d).d.ptr;
      lVar7 = (pQVar6->props).d.size;
      if (lVar7 != 0) {
        pPVar2 = (pQVar6->props).d.ptr;
        lVar8 = 0x28;
        do {
          if (*(int *)((long)&pPVar2[-1].key + lVar8) == 0) {
            pQVar6->hashDirty = true;
            pDVar3 = (pQVar6->props).d.d;
            if ((pDVar3 == (Data *)0x0) || (1 < (int)(pDVar3->super_QArrayData).ref_._q_value)) {
              QArrayDataPointer<(anonymous_namespace)::Property>::reallocateAndGrow
                        (&(pQVar6->props).d,GrowsAtEnd,0,
                         (QArrayDataPointer<(anonymous_namespace)::Property> *)pPVar2);
            }
            pPVar4 = (pQVar6->props).d.ptr;
            pPVar2 = (Property *)((long)&pPVar4->key + lVar8);
            __dest = (Property *)((long)&pPVar4[-1].key + lVar8);
            ::QVariant::~QVariant((QVariant *)((long)pPVar4 + lVar8 + -0x20));
            pPVar5 = (pQVar6->props).d.ptr;
            if ((__dest == pPVar5) && (pPVar2 != pPVar5 + (pQVar6->props).d.size)) {
              (pQVar6->props).d.ptr = pPVar2;
            }
            else if (pPVar2 != pPVar5 + (pQVar6->props).d.size) {
              memmove(__dest,pPVar2,
                      (long)(pPVar5 + (pQVar6->props).d.size) + (-lVar8 - (long)pPVar4));
            }
            pqVar1 = &(pQVar6->props).d.size;
            *pqVar1 = *pqVar1 + -1;
            break;
          }
          lVar8 = lVar8 + 0x28;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
  }
  else {
    if (pQVar6 == (QTextFormatPrivate *)0x0) {
      pQVar6 = (QTextFormatPrivate *)operator_new(0x40);
      (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      (pQVar6->props).d.d = (Data *)0x0;
      (pQVar6->props).d.ptr = (Property *)0x0;
      (pQVar6->props).d.size = 0;
      pQVar6->hashDirty = true;
      pQVar6->fontDirty = true;
      pQVar6->hashValue = 0;
      QFont::QFont(&pQVar6->fnt);
      QSharedDataPointer<QTextFormatPrivate>::reset(&this->d,pQVar6);
    }
    pQVar6 = (this->d).d.ptr;
    if ((pQVar6 != (QTextFormatPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QTextFormatPrivate>::detach_helper(&this->d);
    }
    pQVar6 = (this->d).d.ptr;
    ::QVariant::QVariant(&QStack_58,o);
    QTextFormatPrivate::insertProperty(pQVar6,0,&QStack_58);
    ::QVariant::~QVariant(&QStack_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextFormat::setObjectIndex(int o)
{
    if (o == -1) {
        if (d.constData())
            d->clearProperty(ObjectIndex);
    } else {
        if (!d.constData())
            d = new QTextFormatPrivate;
        // ### type
        d->insertProperty(ObjectIndex, o);
    }
}